

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O3

ssize_t bzip2_filter_read(archive_read_filter *self,void **p)

{
  archive_read_filter *strm;
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  char *pcVar5;
  archive_read_filter *filter;
  archive_read *a;
  char *detail;
  ssize_t ret;
  long local_30;
  
  strm = (archive_read_filter *)self->data;
  if (*(char *)((long)&strm->code + 1) == '\0') {
    strm->archive = (archive_read *)strm->data;
    *(uint *)&strm->open = *(uint *)&strm->name;
    filter = self;
    do {
      if ((char)strm->code == '\0') {
        iVar2 = bzip2_reader_bid((archive_read_filter_bidder *)filter,self->upstream);
        if (iVar2 != 0) {
          iVar2 = BZ2_bzDecompressInit((bz_stream *)strm,0,0);
          local_30 = (long)iVar2;
          if (iVar2 == -3) {
            iVar2 = BZ2_bzDecompressInit((bz_stream *)strm,0,1);
            local_30 = (long)iVar2;
          }
          if (local_30 != 0) {
            if (local_30 == -9) {
              iVar2 = -1;
              pcVar3 = "mis-compiled library";
            }
            else if (local_30 == -2) {
              iVar2 = -1;
              pcVar3 = "invalid setup parameter";
            }
            else {
              if (local_30 != -3) {
                iVar2 = -1;
                pcVar5 = "";
                pcVar3 = (char *)0x0;
                goto LAB_003aaa9d;
              }
              iVar2 = 0xc;
              pcVar3 = "out of memory";
            }
            pcVar5 = ": ";
LAB_003aaa9d:
            archive_set_error(&self->archive->archive,iVar2,
                              "Internal error initializing decompressor%s%s",pcVar5,pcVar3);
            return -0x1e;
          }
          *(undefined1 *)&strm->code = 1;
          local_30 = 0;
          goto LAB_003aa989;
        }
LAB_003aaa23:
        *(undefined1 *)((long)&strm->code + 1) = 1;
        break;
      }
LAB_003aa989:
      pcVar3 = (char *)__archive_read_filter_ahead(self->upstream,1,&local_30);
      if (pcVar3 == (char *)0x0) {
        a = self->archive;
        pcVar3 = "truncated bzip2 input";
        goto LAB_003aaa5d;
      }
      strm->position = (int64_t)pcVar3;
      *(uint *)&strm->bidder = (uint)local_30;
      if (local_30 == 0) goto LAB_003aaa23;
      iVar2 = BZ2_bzDecompress((bz_stream *)strm);
      local_30 = (long)iVar2;
      filter = self->upstream;
      __archive_read_filter_consume(filter,(long)strm->position - (long)pcVar3);
      if (local_30 != 0) {
        if (local_30 != 4) {
          a = self->archive;
          pcVar3 = "bzip decompression failed";
LAB_003aaa5d:
          archive_set_error(&a->archive,-1,pcVar3);
          return -0x1e;
        }
        filter = strm;
        iVar2 = BZ2_bzDecompressEnd((bz_stream *)strm);
        if (iVar2 != 0) {
          a = self->archive;
          pcVar3 = "Failed to clean up decompressor";
          goto LAB_003aaa5d;
        }
        *(undefined1 *)&strm->code = 0;
      }
    } while (*(uint *)&strm->open != 0);
    pvVar1 = strm->data;
    *p = pvVar1;
    sVar4 = (long)strm->archive - (long)pvVar1;
  }
  else {
    *p = (void *)0x0;
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

static ssize_t
bzip2_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	const char *read_buf;
	ssize_t ret;

	state = (struct private_data *)self->data;

	if (state->eof) {
		*p = NULL;
		return (0);
	}

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	for (;;) {
		if (!state->valid) {
			if (bzip2_reader_bid(self->bidder, self->upstream) == 0) {
				state->eof = 1;
				*p = state->out_block;
				decompressed = state->stream.next_out
				    - state->out_block;
				return (decompressed);
			}
			/* Initialize compression library. */
			ret = BZ2_bzDecompressInit(&(state->stream),
					   0 /* library verbosity */,
					   0 /* don't use low-mem algorithm */);

			/* If init fails, try low-memory algorithm instead. */
			if (ret == BZ_MEM_ERROR)
				ret = BZ2_bzDecompressInit(&(state->stream),
					   0 /* library verbosity */,
					   1 /* do use low-mem algo */);

			if (ret != BZ_OK) {
				const char *detail = NULL;
				int err = ARCHIVE_ERRNO_MISC;
				switch (ret) {
				case BZ_PARAM_ERROR:
					detail = "invalid setup parameter";
					break;
				case BZ_MEM_ERROR:
					err = ENOMEM;
					detail = "out of memory";
					break;
				case BZ_CONFIG_ERROR:
					detail = "mis-compiled library";
					break;
				}
				archive_set_error(&self->archive->archive, err,
				    "Internal error initializing decompressor%s%s",
				    detail == NULL ? "" : ": ",
				    detail);
				return (ARCHIVE_FATAL);
			}
			state->valid = 1;
		}

		/* stream.next_in is really const, but bzlib
		 * doesn't declare it so. <sigh> */
		read_buf =
		    __archive_read_filter_ahead(self->upstream, 1, &ret);
		if (read_buf == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated bzip2 input");
			return (ARCHIVE_FATAL);
		}
		state->stream.next_in = (char *)(uintptr_t)read_buf;
		state->stream.avail_in = ret;
		/* There is no more data, return whatever we have. */
		if (ret == 0) {
			state->eof = 1;
			*p = state->out_block;
			decompressed = state->stream.next_out
			    - state->out_block;
			return (decompressed);
		}

		/* Decompress as much as we can in one pass. */
		ret = BZ2_bzDecompress(&(state->stream));
		__archive_read_filter_consume(self->upstream,
		    state->stream.next_in - read_buf);

		switch (ret) {
		case BZ_STREAM_END: /* Found end of stream. */
			switch (BZ2_bzDecompressEnd(&(state->stream))) {
			case BZ_OK:
				break;
			default:
				archive_set_error(&(self->archive->archive),
					  ARCHIVE_ERRNO_MISC,
					  "Failed to clean up decompressor");
				return (ARCHIVE_FATAL);
			}
			state->valid = 0;
			/* FALLTHROUGH */
		case BZ_OK: /* Decompressor made some progress. */
			/* If we filled our buffer, update stats and return. */
			if (state->stream.avail_out == 0) {
				*p = state->out_block;
				decompressed = state->stream.next_out
				    - state->out_block;
				return (decompressed);
			}
			break;
		default: /* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC, "bzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}
}